

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void MIR_gen_set_debug_file(MIR_context_t ctx,FILE *f)

{
  if (ctx->gen_ctx != (gen_ctx *)0x0) {
    ctx->gen_ctx->debug_file = f;
    return;
  }
  fwrite("Calling MIR_gen_set_debug_file before MIR_gen_init -- good bye\n",0x3f,1,_stderr);
  exit(1);
}

Assistant:

void MIR_gen_set_debug_file (MIR_context_t ctx, FILE *f) {
#if !MIR_NO_GEN_DEBUG
  gen_ctx_t gen_ctx = *gen_ctx_loc (ctx);
  if (gen_ctx == NULL) {
    fprintf (stderr, "Calling MIR_gen_set_debug_file before MIR_gen_init -- good bye\n");
    exit (1);
  }
  debug_file = f;
#endif
}